

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_json.c
# Opt level: O0

LY_ERR lydjson_parse_instance_inner
                 (lyd_json_ctx *lydctx,lysc_node *snode,lysc_ext_instance *ext,
                 LYJSON_PARSER_STATUS *status,lyd_node **node)

{
  uint32_t uVar1;
  lyd_node *parent;
  LY_ERR LVar2;
  LYJSON_PARSER_STATUS LVar3;
  LY_ERR LVar4;
  lyd_node **pplVar5;
  ly_err_item *plVar6;
  ly_err_item *__eitem_2;
  ly_err_item *__eitem_1;
  ly_err_item *__eitem;
  LY_ERR ret__;
  uint32_t prev_parse_opts;
  LY_ERR rc;
  LY_ERR r;
  lyd_node **node_local;
  LYJSON_PARSER_STATUS *status_local;
  lysc_ext_instance *ext_local;
  lysc_node *snode_local;
  lyd_json_ctx *lydctx_local;
  
  ret__ = LY_SUCCESS;
  uVar1 = lydctx->parse_opts;
  if (*status == LYJSON_OBJECT) {
    lydctx_local._4_4_ = lyd_create_inner(snode,node);
    if (lydctx_local._4_4_ == LY_SUCCESS) {
      ly_log_location((lysc_node *)0x0,*node,(char *)0x0,(ly_in *)0x0);
      if (ext != (lysc_ext_instance *)0x0) {
        lydctx->parse_opts = lydctx->parse_opts | 0x10000;
      }
      do {
        parent = *node;
        pplVar5 = lyd_node_child_p(*node);
        LVar2 = lydjson_subtree_r(lydctx,parent,pplVar5,(ly_set *)0x0);
        if ((LVar2 != LY_SUCCESS) &&
           ((((plVar6 = ly_err_last(lydctx->jsonctx->ctx), LVar2 != LY_EVALID ||
              (lydctx == (lyd_json_ctx *)0x0)) || ((lydctx->val_opts & 4) == 0)) ||
            (ret__ = LVar2, plVar6->vecode == LYVE_SYNTAX)))) goto LAB_00151ae6;
        LVar3 = lyjson_ctx_status(lydctx->jsonctx);
        *status = LVar3;
      } while (*status == LYJSON_OBJECT_NEXT);
      pplVar5 = lyd_node_child_p(*node);
      LVar2 = lydjson_metadata_finish(lydctx,pplVar5);
      if ((LVar2 == LY_SUCCESS) &&
         ((((snode->nodetype != 0x10 || (LVar2 = lyd_parser_check_keys(*node), LVar2 == LY_SUCCESS))
           || (((plVar6 = ly_err_last(lydctx->jsonctx->ctx), LVar2 == LY_EVALID &&
                ((lydctx != (lyd_json_ctx *)0x0 && ((lydctx->val_opts & 4) != 0)))) &&
               (ret__ = LVar2, plVar6->vecode != LYVE_SYNTAX)))) &&
          (((LVar2 = ret__, (lydctx->parse_opts & 0x10000) == 0 && (ret__ == LY_SUCCESS)) &&
           (LVar4 = lyd_parser_validate_new_implicit((lyd_ctx *)lydctx,*node), LVar4 != LY_SUCCESS))
          )))) {
        ly_err_last(lydctx->jsonctx->ctx);
        LVar2 = LVar4;
      }
LAB_00151ae6:
      ret__ = LVar2;
      lydctx->parse_opts = uVar1;
      ly_log_location_revert(0,1,0,0);
      if ((*node)->hash == 0) {
        lyd_free_tree(*node);
        *node = (lyd_node *)0x0;
      }
      lydctx_local._4_4_ = ret__;
    }
  }
  else {
    lydctx_local._4_4_ = LY_ENOT;
  }
  return lydctx_local._4_4_;
}

Assistant:

static LY_ERR
lydjson_parse_instance_inner(struct lyd_json_ctx *lydctx, const struct lysc_node *snode, struct lysc_ext_instance *ext,
        enum LYJSON_PARSER_STATUS *status, struct lyd_node **node)
{
    LY_ERR r, rc = LY_SUCCESS;
    uint32_t prev_parse_opts = lydctx->parse_opts;

    LY_CHECK_RET(*status != LYJSON_OBJECT, LY_ENOT);

    /* create inner node */
    LY_CHECK_RET(lyd_create_inner(snode, node));

    /* use it for logging */
    LOG_LOCSET(NULL, *node);

    if (ext) {
        /* only parse these extension data and validate afterwards */
        lydctx->parse_opts |= LYD_PARSE_ONLY;
    }

    /* process children */
    do {
        r = lydjson_subtree_r(lydctx, *node, lyd_node_child_p(*node), NULL);
        LY_DPARSER_ERR_GOTO(r, rc = r, lydctx, cleanup);

        *status = lyjson_ctx_status(lydctx->jsonctx);
    } while (*status == LYJSON_OBJECT_NEXT);

    /* finish linking metadata */
    r = lydjson_metadata_finish(lydctx, lyd_node_child_p(*node));
    LY_CHECK_ERR_GOTO(r, rc = r, cleanup);

    if (snode->nodetype == LYS_LIST) {
        /* check all keys exist */
        r = lyd_parser_check_keys(*node);
        LY_DPARSER_ERR_GOTO(r, rc = r, lydctx, cleanup);
    }

    if (!(lydctx->parse_opts & LYD_PARSE_ONLY) && !rc) {
        /* new node validation */
        r = lyd_parser_validate_new_implicit((struct lyd_ctx *)lydctx, *node);
        LY_DPARSER_ERR_GOTO(r, rc = r, lydctx, cleanup);
    }

cleanup:
    lydctx->parse_opts = prev_parse_opts;
    LOG_LOCBACK(0, 1);
    if (!(*node)->hash) {
        /* list without keys is unusable */
        lyd_free_tree(*node);
        *node = NULL;
    }
    return rc;
}